

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe16At0(uint8_t *buf)

{
  return (ulong)(ushort)(*(ushort *)buf << 8 | *(ushort *)buf >> 8);
}

Assistant:

std::uint64_t readFlUIntBe16At0(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res &= UINT64_C(0xffff);
    return res;
}